

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biginteger.cpp
# Opt level: O2

BigInteger * __thiscall
BigInteger::_divide_long(BigInteger *__return_storage_ptr__,BigInteger *this,BigInteger *a)

{
  const_iterator __position;
  ulong uVar1;
  compare_t cVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  size_type __n;
  BigInteger ans;
  BigInteger local_70;
  BigInteger local_50;
  
  a->negative = false;
  this->negative = false;
  ans.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  ans.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  ans.negative = false;
  ans.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ans.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._0_1_ = 0;
  ans.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish._1_7_ = 0;
  cVar2 = _compareAbs(this,a);
  if (cVar2 < CMP_EQUAL) {
    BigInteger(__return_storage_ptr__,0);
  }
  else {
    __n = 0;
    while( true ) {
      cVar2 = _compareAbs(this,a);
      __position._M_current =
           (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
      if (cVar2 < CMP_EQUAL) break;
      local_70.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_insert_rval
                (&a->digits,__position,(value_type *)&local_70);
      __n = __n + 1;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase(&a->digits,__position);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve(&ans.digits,__n);
    while (iVar5 = (int)__n, __n = (size_type)(iVar5 - 1), iVar5 != 0) {
      uVar1 = 1000000000;
      iVar5 = 0;
      while (uVar4 = uVar1, iVar3 = (int)uVar4, iVar5 + 1 < iVar3) {
        uVar1 = (long)(iVar5 + iVar3) / 2;
        iVar3 = (int)uVar1;
        BigInteger(&local_50,(long)iVar3);
        ::operator*(&local_70,a,&local_50);
        cVar2 = _compareAbs(this,&local_70);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70);
        std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                  ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
        uVar1 = uVar1 & 0xffffffff;
        if (CMP_LESS < cVar2) {
          uVar1 = uVar4;
          iVar5 = iVar3;
        }
      }
      local_70.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = iVar5;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&ans.digits,(uint *)&local_70);
      BigInteger(&local_50,(long)iVar5);
      ::operator*(&local_70,a,&local_50);
      operator-=(this,&local_70);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_70);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_50);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                (&a->digits,
                 (const_iterator)
                 (a->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                 .super__Vector_impl_data._M_start);
    }
    std::
    __reverse<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
              (ans.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start,
               CONCAT71(ans.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish._1_7_,
                        ans.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish._0_1_));
    normalize(&ans);
    (__return_storage_ptr__->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
    ._M_impl.super__Vector_impl_data._M_start =
         ans.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT71(ans.digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish._1_7_,
                           ans.digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_finish._0_1_);
    (__return_storage_ptr__->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT71(ans.digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._1_7_,
                           ans.digits.
                           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._0_1_);
    ans.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    ans.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
    ans.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    ans.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish._0_1_ = 0;
    ans.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish._1_7_ = 0;
    __return_storage_ptr__->negative = ans.negative;
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&ans);
  return __return_storage_ptr__;
}

Assistant:

const BigInteger BigInteger::_divide_long(BigInteger a) noexcept
{
    negative = a.negative = false;
    BigInteger ans;
    if(_compareAbs(a) < 0)
        return 0;
    int shift = 0;
    while(_compareAbs(a) >= 0)
    {
        a.digits.insert(a.digits.begin(), 0);
        ++shift;
    }
    a.digits.erase(a.digits.begin());
    ans.digits.reserve(shift);
    for(; shift; --shift)
    {
        int l = 0, r = BLOCK_MOD;
        while(l + 1 < r)
        {
            int m = (l + r) / 2;
            if(_compareAbs(a * m) < 0)
                r = m;
            else
                l = m;
        }
        ans.digits.push_back(l);
        *this -= a * l;
        a.digits.erase(a.digits.begin());
    }
    std::reverse(ans.digits.begin(), ans.digits.end());
    ans.normalize();
    return ans;
}